

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O0

Expression * __thiscall
soul::StructuralParser::checkAndCreateArrayElementRef
          (StructuralParser *this,Context *c,Expression *lhs,pool_ptr<soul::AST::Expression> *start,
          pool_ptr<soul::AST::Expression> *end)

{
  bool bVar1;
  Context *this_00;
  Expression *pEVar2;
  Constant *pCVar3;
  Type *pTVar4;
  ArrayElementRef *pAVar5;
  bool local_24a;
  byte local_231;
  byte local_219;
  bool local_1e9;
  CompileMessage local_1e8;
  int64_t local_1b0;
  int64_t e;
  int64_t s;
  CompileMessage local_168;
  pool_ptr<soul::AST::Constant> local_130;
  pool_ptr<soul::AST::Constant> endConst;
  pool_ptr<soul::AST::Constant> startConst;
  pool_ptr<soul::AST::Expression> local_118;
  pool_ptr<soul::AST::Expression> local_110;
  CompileMessage local_108;
  byte local_c9;
  pool_ptr<soul::AST::Expression> local_c8;
  CompileMessage local_c0;
  byte local_81;
  pool_ptr<soul::AST::Expression> local_80 [3];
  CompileMessage local_68;
  pool_ptr<soul::AST::Expression> *local_30;
  pool_ptr<soul::AST::Expression> *end_local;
  pool_ptr<soul::AST::Expression> *start_local;
  Expression *lhs_local;
  Context *c_local;
  StructuralParser *this_local;
  
  local_30 = end;
  end_local = start;
  start_local = (pool_ptr<soul::AST::Expression> *)lhs;
  lhs_local = (Expression *)c;
  c_local = (Context *)this;
  bVar1 = AST::isPossiblyValue(lhs);
  if ((!bVar1) && (bVar1 = AST::isPossiblyEndpoint((Expression *)start_local), !bVar1)) {
    this_00 = (Context *)(start_local + 2);
    Errors::expectedValueOrEndpoint<>();
    AST::Context::throwError(this_00,&local_68,false);
  }
  bVar1 = pool_ptr<soul::AST::Expression>::operator!=(start,(void *)0x0);
  local_81 = 0;
  local_219 = 0;
  if (bVar1) {
    local_80[0] = (pool_ptr<soul::AST::Expression>)start->object;
    local_81 = 1;
    bVar1 = AST::isPossiblyValue(local_80);
    local_219 = bVar1 ^ 0xff;
  }
  if ((local_81 & 1) != 0) {
    pool_ptr<soul::AST::Expression>::~pool_ptr(local_80);
  }
  if ((local_219 & 1) != 0) {
    pEVar2 = pool_ptr<soul::AST::Expression>::operator->(start);
    Errors::expectedValue<>();
    AST::Context::throwError(&(pEVar2->super_Statement).super_ASTObject.context,&local_c0,false);
  }
  bVar1 = pool_ptr<soul::AST::Expression>::operator!=(end,(void *)0x0);
  local_c9 = 0;
  local_231 = 0;
  if (bVar1) {
    local_c8 = (pool_ptr<soul::AST::Expression>)end->object;
    local_c9 = 1;
    bVar1 = AST::isPossiblyValue(&local_c8);
    local_231 = bVar1 ^ 0xff;
  }
  if ((local_c9 & 1) != 0) {
    pool_ptr<soul::AST::Expression>::~pool_ptr(&local_c8);
  }
  if ((local_231 & 1) != 0) {
    pEVar2 = pool_ptr<soul::AST::Expression>::operator->(end);
    Errors::expectedValue<>();
    AST::Context::throwError(&(pEVar2->super_Statement).super_ASTObject.context,&local_108,false);
  }
  local_110 = (pool_ptr<soul::AST::Expression>)start->object;
  bVar1 = AST::isResolvedAsConstant(&local_110);
  local_24a = false;
  if (bVar1) {
    local_118 = (pool_ptr<soul::AST::Expression>)end->object;
    local_24a = AST::isResolvedAsConstant(&local_118);
    pool_ptr<soul::AST::Expression>::~pool_ptr(&local_118);
  }
  pool_ptr<soul::AST::Expression>::~pool_ptr(&local_110);
  if (local_24a != false) {
    pEVar2 = pool_ptr<soul::AST::Expression>::operator->(start);
    (*(pEVar2->super_Statement).super_ASTObject._vptr_ASTObject[0xd])(&endConst);
    pEVar2 = pool_ptr<soul::AST::Expression>::operator->(end);
    (*(pEVar2->super_Statement).super_ASTObject._vptr_ASTObject[0xd])(&local_130);
    pCVar3 = pool_ptr<soul::AST::Constant>::operator->(&endConst);
    pTVar4 = soul::Value::getType(&pCVar3->value);
    bVar1 = Type::isInteger(pTVar4);
    if (!bVar1) {
      pEVar2 = pool_ptr<soul::AST::Expression>::operator->(start);
      Errors::expectedInteger<>();
      AST::Context::throwError(&(pEVar2->super_Statement).super_ASTObject.context,&local_168,false);
    }
    pCVar3 = pool_ptr<soul::AST::Constant>::operator->(&local_130);
    pTVar4 = soul::Value::getType(&pCVar3->value);
    bVar1 = Type::isInteger(pTVar4);
    if (!bVar1) {
      pEVar2 = pool_ptr<soul::AST::Expression>::operator->(end);
      Errors::expectedInteger<>();
      AST::Context::throwError
                (&(pEVar2->super_Statement).super_ASTObject.context,(CompileMessage *)&s,false);
    }
    pCVar3 = pool_ptr<soul::AST::Constant>::operator->(&endConst);
    e = soul::Value::getAsInt64(&pCVar3->value);
    pCVar3 = pool_ptr<soul::AST::Constant>::operator->(&local_130);
    local_1b0 = soul::Value::getAsInt64(&pCVar3->value);
    if ((((-1 < e) && (-1 < local_1b0)) && (local_1b0 <= e)) ||
       (((e < 0 && (local_1b0 < 0)) && (local_1b0 <= e)))) {
      pEVar2 = pool_ptr<soul::AST::Expression>::operator->(end);
      Errors::illegalSliceSize<>();
      AST::Context::throwError(&(pEVar2->super_Statement).super_ASTObject.context,&local_1e8,false);
    }
    pool_ptr<soul::AST::Constant>::~pool_ptr(&local_130);
    pool_ptr<soul::AST::Constant>::~pool_ptr(&endConst);
  }
  local_1e9 = true;
  pAVar5 = allocate<soul::AST::ArrayElementRef,soul::AST::Context_const&,soul::AST::Expression&,soul::pool_ptr<soul::AST::Expression>&,soul::pool_ptr<soul::AST::Expression>&,bool>
                     (this,(Context *)lhs_local,(Expression *)start_local,start,end,&local_1e9);
  return &pAVar5->super_Expression;
}

Assistant:

AST::Expression& checkAndCreateArrayElementRef (const AST::Context& c, AST::Expression& lhs,
                                                    pool_ptr<AST::Expression> start,
                                                    pool_ptr<AST::Expression> end)
    {
        if (! (AST::isPossiblyValue (lhs) || AST::isPossiblyEndpoint (lhs)))
            lhs.context.throwError (Errors::expectedValueOrEndpoint());

        if (start != nullptr && ! AST::isPossiblyValue (start))   start->context.throwError (Errors::expectedValue());
        if (end != nullptr   && ! AST::isPossiblyValue (end))     end->context.throwError (Errors::expectedValue());

        if (AST::isResolvedAsConstant (start) && AST::isResolvedAsConstant (end))
        {
            auto startConst = start->getAsConstant();
            auto endConst = end->getAsConstant();

            if (! startConst->value.getType().isInteger())  start->context.throwError (Errors::expectedInteger());
            if (! endConst->value.getType().isInteger())    end->context.throwError (Errors::expectedInteger());

            auto s = startConst->value.getAsInt64();
            auto e = endConst->value.getAsInt64();

            if ((s >= 0 && e >= 0 && s >= e) || (s < 0 && e < 0 && s >= e))
                end->context.throwError (Errors::illegalSliceSize());
        }

        return allocate<AST::ArrayElementRef> (c, lhs, start, end, true);
    }